

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RunSomeIndexTests.cpp
# Opt level: O2

int main(int ac,char **av)

{
  bool bVar1;
  int iVar2;
  char *__haystack;
  char *pcVar3;
  clock_t cVar4;
  clock_t cVar5;
  ulong uVar6;
  char *pcVar7;
  bool bVar8;
  bool bVar9;
  int testNum;
  
  testNum = 0;
  if (ac < 2) {
    puts("Available tests:");
    printf("%3d. %s\n",0,"utilitytest");
    printf("To run a test, enter the test number: ");
    fflush(_stdout);
    iVar2 = __isoc99_scanf("%d",&testNum);
    if (iVar2 != 1) {
      pcVar7 = "Couldn\'t parse that input as a number";
LAB_0010a19b:
      puts(pcVar7);
      return -1;
    }
    if (0 < testNum) {
      pcVar7 = "%3d is an invalid test number.\n";
      goto LAB_0010a2ed;
    }
    ac = ac + -1;
    av = av + 1;
    bVar8 = false;
    if (testNum == -1) goto LAB_0010a1aa;
    bVar9 = true;
    pcVar7 = (char *)0x0;
    iVar2 = testNum;
  }
  else {
    pcVar7 = av[1];
    if (*pcVar7 == '-') {
      if (pcVar7[1] == 'R') {
        bVar8 = pcVar7[2] == '\0';
        if (ac == 2 && bVar8) {
          pcVar7 = "-R needs an additional parameter.";
          goto LAB_0010a19b;
        }
        uVar6 = (ulong)(pcVar7[2] == '\0');
      }
      else {
        uVar6 = 0;
        bVar8 = false;
      }
      if ((pcVar7[1] == 'A') && (pcVar7[2] == '\0')) {
        puts("TAP version 13");
        printf("1..%d\n",1);
        if ((ac == 2) || (iVar2 = isTestSkipped("utilitytest",ac + -2,av + 2), iVar2 == 0)) {
          cVar4 = clock();
          iVar2 = utilitytest(ac,av);
          cVar5 = clock();
          pcVar7 = "ok";
          if (iVar2 == -1) {
            pcVar7 = "not ok";
          }
          printf("%s %d %s # %f\n",(double)(cVar5 - cVar4) / 1000000.0,pcVar7,1,"utilitytest");
        }
        else {
          printf("ok %d %s # SKIP\n",1,"utilitytest");
        }
        puts("All tests finished.");
        return 0;
      }
    }
    else {
LAB_0010a1aa:
      bVar8 = false;
      uVar6 = 0;
    }
    pcVar7 = lowercase(av[uVar6 + 1]);
    bVar9 = (int)uVar6 == 0;
    iVar2 = -1;
  }
  bVar1 = true;
  while ((bVar1 && (iVar2 == -1))) {
    __haystack = lowercase("utilitytest");
    if ((bVar8) && (pcVar3 = strstr(__haystack,pcVar7), pcVar3 != (char *)0x0)) {
      ac = ac + -2;
      av = av + 2;
LAB_0010a27c:
      iVar2 = 0;
    }
    else {
      if ((bVar9) && (iVar2 = strcmp(__haystack,pcVar7), iVar2 == 0)) {
        ac = ac + -1;
        av = av + 1;
        goto LAB_0010a27c;
      }
      iVar2 = -1;
    }
    free(__haystack);
    bVar1 = false;
  }
  free(pcVar7);
  if (iVar2 == -1) {
    puts("Available tests:");
    printf("%3d. %s\n",0,"utilitytest");
    printf("Failed: %s is an invalid test name.\n",av[1]);
    return -1;
  }
  if (-1 < iVar2) {
    iVar2 = utilitytest(ac,av);
    return iVar2;
  }
  pcVar7 = "testToRun was modified by TestDriver code to an invalid value: %3d.\n";
LAB_0010a2ed:
  printf(pcVar7,(ulong)(uint)testNum);
  return -1;
}

Assistant:

int main(int ac, char* av[])
{
  int i;
  int testNum = 0;
  int partial_match;
  int run_all;
  char *arg;
  int testToRun = -1;

  

  /* If no test name was given */
  /* process command line with user function.  */
  if (ac < 2) {
    /* Ask for a test.  */
    printf("Available tests:\n");
    for (i = 0; i < NumTests; ++i) {
      printf("%3d. %s\n", i, cmakeGeneratedFunctionMapEntries[i].name);
    }
    printf("To run a test, enter the test number: ");
    fflush(stdout);
    if (scanf("%d", &testNum) != 1) {
      printf("Couldn't parse that input as a number\n");
      return -1;
    }
    if (testNum >= NumTests) {
      printf("%3d is an invalid test number.\n", testNum);
      return -1;
    }
    testToRun = testNum;
    ac--;
    av++;
  }
  partial_match = 0;
  run_all = 0;
  arg = CM_NULL; /* NOLINT */
  /* If partial match or running all tests are requested.  */
  if (testToRun == -1 && ac > 1) {
    partial_match = (strcmp(av[1], "-R") == 0) ? 1 : 0;
    run_all = (strcmp(av[1], "-A") == 0) ? 1 : 0;
  }
  if (partial_match != 0 && ac < 3) {
    printf("-R needs an additional parameter.\n");
    return -1;
  }
  if (run_all == 1) {
    clock_t t;
    int status = 0;
    const char* status_message = CM_NULL;
    printf("TAP version 13\n");
    printf("1..%d\n", NumTests);
    for (i = 0; i < NumTests; ++i) {
      const char *name = cmakeGeneratedFunctionMapEntries[i].name;
      if (ac > 2) {
        if (isTestSkipped(name, ac - 2, av + 2) == 1) {
          printf("ok %d %s # SKIP\n", i + 1, name);
          continue;
        }
      }
      t = clock();
      status = (*cmakeGeneratedFunctionMapEntries[i].func)(ac, av);
      t = clock() - t;
      status_message = (status == -1) ? "not ok" : "ok";
      {
        double time_taken = CM_CAST(double, t) / CLOCKS_PER_SEC;
        printf("%s %d %s # %f\n", status_message, i + 1, name, time_taken);
      }
    }
    printf("All tests finished.\n");

    return 0;
  }

  if (testToRun == -1) {
    arg = lowercase(av[1 + partial_match]);
  }
  for (i = 0; i < NumTests && testToRun == -1; ++i) {
    char *test_name = lowercase(cmakeGeneratedFunctionMapEntries[i].name);
    if (partial_match != 0 && strstr(test_name, arg) != CM_NULL) { /* NOLINT */
      testToRun = i;
      ac -= 2;
      av += 2;
    } else if (partial_match == 0 && strcmp(test_name, arg) == 0) {
      testToRun = i;
      ac--;
      av++;
    }
    free(test_name);
  }
  free(arg);
  if (testToRun != -1) {
    int result;

    if (testToRun < 0 || testToRun >= NumTests) {
      printf("testToRun was modified by TestDriver code to an invalid value: "
             "%3d.\n",
             testNum);
      return -1;
    }
    result = (*cmakeGeneratedFunctionMapEntries[testToRun].func)(ac, av);

    return result;
  }

  /* Nothing was run, display the test names.  */
  printf("Available tests:\n");
  for (i = 0; i < NumTests; ++i) {
    printf("%3d. %s\n", i, cmakeGeneratedFunctionMapEntries[i].name);
  }
  printf("Failed: %s is an invalid test name.\n", av[1]);

  return -1;
}